

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

logical pnga_patch_intersect(Integer *lo,Integer *hi,Integer *lop,Integer *hip,Integer ndim)

{
  long lVar1;
  long lVar2;
  
  if (0 < ndim) {
    lVar1 = 0;
    do {
      if (hi[lVar1] < lo[lVar1]) {
        return 0;
      }
      if (hip[lVar1] < lop[lVar1]) {
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (ndim != lVar1);
  }
  if (0 < ndim) {
    lVar1 = 0;
    do {
      if (hi[lVar1] < lop[lVar1]) {
        return 0;
      }
      if (hip[lVar1] < lo[lVar1]) {
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (ndim != lVar1);
  }
  if (0 < ndim) {
    lVar1 = 0;
    do {
      lVar2 = lop[lVar1];
      if (lop[lVar1] < lo[lVar1]) {
        lVar2 = lo[lVar1];
      }
      lop[lVar1] = lVar2;
      lVar2 = hip[lVar1];
      if (hi[lVar1] < hip[lVar1]) {
        lVar2 = hi[lVar1];
      }
      hip[lVar1] = lVar2;
      lVar1 = lVar1 + 1;
    } while (ndim != lVar1);
  }
  return 1;
}

Assistant:

logical pnga_patch_intersect(Integer *lo, Integer *hi,
                        Integer *lop, Integer *hip, Integer ndim)
{
    Integer i;
    
    /* check consistency of patch coordinates */
    for(i=0; i<ndim; i++) {
        if(hi[i] < lo[i]) return FALSE; /* inconsistent */
        if(hip[i] < lop[i]) return FALSE; /* inconsistent */
    }
    
    /* find the intersection and update (ilop: ihip, jlop: jhip) */
    for(i=0; i<ndim; i++) {
        if(hi[i] < lop[i]) return FALSE; /* don't intersect */
        if(hip[i] < lo[i]) return FALSE; /* don't intersect */
    }
    
    for(i=0; i<ndim; i++) {
        lop[i] = GA_MAX(lo[i], lop[i]);
        hip[i] = GA_MIN(hi[i], hip[i]);
    }
    
    return TRUE;
}